

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_composition_test.cpp
# Opt level: O2

void __thiscall
CatcherComposition_Tests::CatcherComposition_with_custom_action_works::test_method
          (CatcherComposition_with_custom_action_works *this)

{
  int hit;
  undefined4 local_1f8;
  undefined4 local_1f0;
  undefined4 local_1e8;
  int *local_1e0;
  undefined1 local_1d8;
  int *local_1d0;
  undefined1 local_1c8;
  int *local_1c0;
  undefined1 local_1b8;
  
  local_1e0 = &hit;
  hit = 0;
  local_1f8 = 0xffffffff;
  local_1f0 = 0xfffffffe;
  local_1e8 = 0xfffffffd;
  local_1d8 = 1;
  local_1c8 = 1;
  local_1b8 = 1;
  local_1d0 = local_1e0;
  local_1c0 = local_1e0;
  throw_bad_alloc();
  throw_std_exception();
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CatcherComposition_with_custom_action_works)
{
   int hit=0;
   auto catcher = all_catcher(             -1, [&hit](){ ++hit; }, 
                     std_exception_handler(-2, [&hit](std::exception&){ ++hit; }, 
                        bad_alloc_handler( -3, [&hit](std::bad_alloc&){ ++hit; }, 
                           UnHandler<>()))); 

   try
   {
      throw_bad_alloc();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(0,hit);
      BOOST_CHECK_EQUAL(-3, catcher.handleException());
      BOOST_CHECK_EQUAL(1,hit);
   }

   try
   {
      throw_std_exception();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(1,hit);
      BOOST_CHECK_EQUAL(-2, catcher.handleException());
      BOOST_CHECK_EQUAL(2,hit);
   }

   try
   {
      throw_int();
   }
   catch (...)
   {
      BOOST_CHECK_EQUAL(2,hit);
      BOOST_CHECK_EQUAL(-1, catcher.handleException());
      BOOST_CHECK_EQUAL(3,hit);
   }
}